

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O1

void __thiscall sznet::net::EventLoop::handleRead(EventLoop *this)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  ssize_t sVar4;
  LogStream *pLVar5;
  char **ppcVar6;
  uint v;
  SourceFile file;
  SourceFile file_00;
  SourceFile file_01;
  SourceFile file_02;
  Logger local_fe8;
  undefined8 local_18;
  uint64_t one;
  
  local_18 = 1;
  sVar4 = read(this->m_wakeupFd,&local_18,8);
  v = (uint)sVar4;
  if ((int)v < 1) {
    if (v == 0) {
      file_01._8_8_ = 0xd;
      file_01.m_data = "EventLoop.cpp";
      Logger::Logger(&local_fe8,file_01,0x121,ERROR);
      if (0x32 < (uint)(((int)&local_fe8 + 0xfb0) - (int)local_fe8.m_impl.m_stream.m_buffer.m_cur))
      {
        builtin_strncpy(local_fe8.m_impl.m_stream.m_buffer.m_cur,
                        "EventLoop::handleRead() m_wakeupFd has been closed",0x32);
        local_fe8.m_impl.m_stream.m_buffer.m_cur = local_fe8.m_impl.m_stream.m_buffer.m_cur + 0x32;
      }
    }
    else {
      iVar3 = sz_getlasterr();
      if ((iVar3 == 4) || (bVar2 = sockets::sz_wouldblock(), bVar2)) {
        file_00._8_8_ = 0xd;
        file_00.m_data = "EventLoop.cpp";
        Logger::Logger(&local_fe8,file_00,0x127,WARN);
        if (0x31 < (uint)(((int)&local_fe8 + 0xfb0) - (int)local_fe8.m_impl.m_stream.m_buffer.m_cur)
           ) {
          builtin_strncpy(local_fe8.m_impl.m_stream.m_buffer.m_cur,
                          "EventLoop::handleRead() recv sz_getlasterr() rst ",0x31);
          local_fe8.m_impl.m_stream.m_buffer.m_cur = local_fe8.m_impl.m_stream.m_buffer.m_cur + 0x31
          ;
        }
        iVar3 = sz_getlasterr();
        pLVar5 = LogStream::operator<<(&local_fe8.m_impl.m_stream,iVar3);
        ppcVar6 = &(pLVar5->m_buffer).m_cur;
        pcVar1 = (pLVar5->m_buffer).m_cur;
        if (0x2c < (uint)((int)ppcVar6 - (int)pcVar1)) {
          builtin_strncpy(pcVar1," is sz_err_eintr or sockets::sz_wouldblock()",0x2c);
          *ppcVar6 = *ppcVar6 + 0x2c;
        }
      }
      else {
        file_02._8_8_ = 0xd;
        file_02.m_data = "EventLoop.cpp";
        Logger::Logger(&local_fe8,file_02,300,ERROR);
        if (0x22 < (uint)(((int)&local_fe8 + 0xfb0) - (int)local_fe8.m_impl.m_stream.m_buffer.m_cur)
           ) {
          builtin_strncpy(local_fe8.m_impl.m_stream.m_buffer.m_cur,
                          "EventLoop::handleRead() recv error",0x22);
          local_fe8.m_impl.m_stream.m_buffer.m_cur = local_fe8.m_impl.m_stream.m_buffer.m_cur + 0x22
          ;
        }
      }
    }
  }
  else {
    if ((v & 0x7fffffff) == 8) {
      return;
    }
    file._8_8_ = 0xd;
    file.m_data = "EventLoop.cpp";
    Logger::Logger(&local_fe8,file,0x11b,ERROR);
    if (0x1e < (uint)(((int)&local_fe8 + 0xfb0) - (int)local_fe8.m_impl.m_stream.m_buffer.m_cur)) {
      builtin_strncpy(local_fe8.m_impl.m_stream.m_buffer.m_cur,"EventLoop::handleRead() reads ",0x1e
                     );
      local_fe8.m_impl.m_stream.m_buffer.m_cur = local_fe8.m_impl.m_stream.m_buffer.m_cur + 0x1e;
    }
    pLVar5 = LogStream::operator<<(&local_fe8.m_impl.m_stream,v);
    ppcVar6 = &(pLVar5->m_buffer).m_cur;
    pcVar1 = (pLVar5->m_buffer).m_cur;
    if (0x13 < (uint)((int)ppcVar6 - (int)pcVar1)) {
      builtin_strncpy(pcVar1," bytes instead of 8",0x13);
      *ppcVar6 = *ppcVar6 + 0x13;
    }
  }
  Logger::~Logger(&local_fe8);
  return;
}

Assistant:

void EventLoop::handleRead()
{
	uint64_t one = 1;
	int n = 0;
#if defined(SZ_OS_WINDOWS)
	n = ::recv(m_wakeupFd.event_read, reinterpret_cast<char*>(&one), sizeof(one), 0);
#else
	n = ::read(m_wakeupFd, (char*)&one, sizeof(one));
#endif
	if (n > 0)
	{
		if (n != sizeof(one))
		{
			LOG_ERROR << "EventLoop::handleRead() reads " << n << " bytes instead of 8";
		}
		return;
	}
	else if (n == 0)
	{
		LOG_ERROR << "EventLoop::handleRead() m_wakeupFd has been closed";
	}
	else
	{
		if (sz_getlasterr() == sz_err_eintr || sockets::sz_wouldblock())
		{
			LOG_WARN << "EventLoop::handleRead() recv sz_getlasterr() rst " 
				<< sz_getlasterr() 
				<< " is sz_err_eintr or sockets::sz_wouldblock()";
			return;
		}
		LOG_ERROR << "EventLoop::handleRead() recv error";
	}
}